

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommand.cxx
# Opt level: O1

void __thiscall cmCustomCommand::SetComment(cmCustomCommand *this,char *comment)

{
  char *pcVar1;
  char *__s;
  
  __s = "";
  if (comment != (char *)0x0) {
    __s = comment;
  }
  pcVar1 = (char *)(this->Comment)._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&this->Comment,0,pcVar1,(ulong)__s);
  this->HaveComment = comment != (char *)0x0;
  return;
}

Assistant:

void cmCustomCommand::SetComment(const char* comment)
{
  this->Comment = comment ? comment : "";
  this->HaveComment = (comment != nullptr);
}